

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.cpp
# Opt level: O2

bool compareInfo(DataFieldInfo *info1,DataFieldInfo *info2)

{
  bool bVar1;
  ostream *poVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  
  bVar1 = std::operator!=(&info1->type_,&info2->type_);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Type: ");
    poVar2 = std::operator<<(poVar2,(string *)&info1->type_);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,(string *)&info2->type_);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  bVar3 = info1->rank_ != info2->rank_;
  if (bVar3) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Rank: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,info1->rank_);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,info2->rank_);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  bVar4 = info1->bytesPerElement_ == info2->bytesPerElement_;
  if (!bVar4) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Bytes per Element: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,info1->bytesPerElement_);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,info2->bytesPerElement_);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  bVar5 = info1->iSize_ == info2->iSize_;
  if (!bVar5) {
    poVar2 = std::operator<<((ostream *)&std::cout,"iSize: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,info1->iSize_);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,info2->iSize_);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  bVar6 = info1->jSize_ == info2->jSize_;
  if (!bVar6) {
    poVar2 = std::operator<<((ostream *)&std::cout,"jSize: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,info1->jSize_);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,info2->jSize_);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  bVar7 = info1->kSize_ == info2->kSize_;
  if (!bVar7) {
    poVar2 = std::operator<<((ostream *)&std::cout,"kSize: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,info1->kSize_);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,info2->kSize_);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  bVar8 = info1->lSize_ == info2->lSize_;
  if (!bVar8) {
    poVar2 = std::operator<<((ostream *)&std::cout,"lSize: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,info1->lSize_);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,info2->lSize_);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return bVar8 && (bVar7 && (bVar6 && (bVar5 && (bVar4 && (!bVar3 && !bVar1)))));
}

Assistant:

bool compareInfo(const DataFieldInfo& info1, const DataFieldInfo& info2)
{
    bool equal = true;
    if (info1.type() != info2.type()) {
        equal = false;
        std::cout << "Type: " << info1.type() << " != " << info2.type() << std::endl;
    }
    if (info1.rank() != info2.rank()) {
        equal = false;
        std::cout << "Rank: " << info1.rank() << " != " << info2.rank() << std::endl;
    }
    if (info1.bytesPerElement() != info2.bytesPerElement()) {
        equal = false;
        std::cout << "Bytes per Element: " << info1.bytesPerElement() << " != " << info2.bytesPerElement() << std::endl;
    }
    if (info1.iSize() != info2.iSize()) {
        equal = false;
        std::cout << "iSize: " << info1.iSize() << " != " << info2.iSize() << std::endl;
    }
    if (info1.jSize() != info2.jSize()) {
        equal = false;
        std::cout << "jSize: " << info1.jSize() << " != " << info2.jSize() << std::endl;
    }
    if (info1.kSize() != info2.kSize()) {
        equal = false;
        std::cout << "kSize: " << info1.kSize() << " != " << info2.kSize() << std::endl;
    }
    if (info1.lSize() != info2.lSize()) {
        equal = false;
        std::cout << "lSize: " << info1.lSize() << " != " << info2.lSize() << std::endl;
    }

    return equal;
}